

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

Bool Conic_To(black_PWorker worker,Long cx,Long cy,Long x,Long y)

{
  int iVar1;
  ulong uVar2;
  Long LVar3;
  ulong uVar4;
  bool overshoot;
  Bool BVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  TStates aState;
  TPoint *base;
  TPoint *pTVar9;
  TPoint arcs [65];
  
  arcs[2].x = worker->lastX;
  arcs[2].y = worker->lastY;
  arcs[1].x = cx;
  arcs[1].y = cy;
  arcs[0].x = x;
  arcs[0].y = y;
  base = arcs;
  do {
    uVar2 = base[2].y;
    LVar3 = base->x;
    uVar4 = base->y;
    uVar7 = uVar4;
    if ((long)uVar4 < (long)uVar2) {
      uVar7 = uVar2;
    }
    uVar8 = uVar4;
    if ((long)uVar2 < (long)uVar4) {
      uVar8 = uVar2;
    }
    if ((base[1].y < (long)uVar8) || ((long)uVar7 < base[1].y)) {
      pTVar9 = base + 2;
      Split_Conic(base);
    }
    else {
      if (uVar2 != uVar4) {
        aState = ((long)uVar4 <= (long)uVar2) + Ascending_State;
        if (worker->state != aState) {
          iVar1 = worker->precision;
          if ((long)uVar2 < (long)uVar4) {
            uVar7 = (-(long)iVar1 & (uVar2 + (long)iVar1) - 1) - uVar2;
          }
          else {
            uVar7 = (long)(iVar1 + -1) & uVar2;
          }
          overshoot = (long)worker->precision_half <= (long)uVar7;
          if ((worker->state != Unknown_State) &&
             (BVar5 = End_Profile(worker,overshoot), BVar5 != '\0')) {
            return '\x01';
          }
          BVar5 = New_Profile(worker,aState,overshoot);
          if (BVar5 != '\0') {
            return '\x01';
          }
        }
        if ((long)uVar2 < (long)uVar4) {
          cVar6 = Bezier_Up(worker,2,base,Split_Conic,worker->minY,worker->maxY);
        }
        else {
          cVar6 = Bezier_Down(worker,2,base,Split_Conic,worker->minY,worker->maxY);
        }
        if (cVar6 != '\0') {
          return '\x01';
        }
      }
      pTVar9 = base + -2;
    }
    base = pTVar9;
    if (pTVar9 < arcs) {
      worker->lastX = LVar3;
      worker->lastY = uVar4;
      return '\0';
    }
  } while( true );
}

Assistant:

static Bool
  Conic_To( RAS_ARGS Long  cx,
                     Long  cy,
                     Long  x,
                     Long  y )
  {
    Long     y1, y2, y3, x3, ymin, ymax;
    TStates  state_bez;
    TPoint   arcs[2 * MaxBezier + 1]; /* The Bezier stack           */
    TPoint*  arc;                     /* current Bezier arc pointer */


    arc      = arcs;
    arc[2].x = ras.lastX;
    arc[2].y = ras.lastY;
    arc[1].x = cx;
    arc[1].y = cy;
    arc[0].x = x;
    arc[0].y = y;

    do
    {
      y1 = arc[2].y;
      y2 = arc[1].y;
      y3 = arc[0].y;
      x3 = arc[0].x;

      /* first, categorize the Bezier arc */

      if ( y1 <= y3 )
      {
        ymin = y1;
        ymax = y3;
      }
      else
      {
        ymin = y3;
        ymax = y1;
      }

      if ( y2 < ymin || y2 > ymax )
      {
        /* this arc has no given direction, split it! */
        Split_Conic( arc );
        arc += 2;
      }
      else if ( y1 == y3 )
      {
        /* this arc is flat, ignore it and pop it from the Bezier stack */
        arc -= 2;
      }
      else
      {
        /* the arc is y-monotonous, either ascending or descending */
        /* detect a change of direction                            */
        state_bez = y1 < y3 ? Ascending_State : Descending_State;
        if ( ras.state != state_bez )
        {
          Bool  o = ( state_bez == Ascending_State )
                      ? IS_BOTTOM_OVERSHOOT( y1 )
                      : IS_TOP_OVERSHOOT( y1 );


          /* finalize current profile if any */
          if ( ras.state != Unknown_State &&
               End_Profile( RAS_VARS o )  )
            goto Fail;

          /* create a new profile */
          if ( New_Profile( RAS_VARS state_bez, o ) )
            goto Fail;
        }

        /* now call the appropriate routine */
        if ( state_bez == Ascending_State )
        {
          if ( Bezier_Up( RAS_VARS 2, arc, Split_Conic,
                                   ras.minY, ras.maxY ) )
            goto Fail;
        }
        else
          if ( Bezier_Down( RAS_VARS 2, arc, Split_Conic,
                                     ras.minY, ras.maxY ) )
            goto Fail;
        arc -= 2;
      }

    } while ( arc >= arcs );

    ras.lastX = x3;
    ras.lastY = y3;

    return SUCCESS;

  Fail:
    return FAILURE;
  }